

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  size_t sVar2;
  PaSampleFormat PVar3;
  size_t __n;
  undefined8 uStack_30;
  size_t local_28;
  size_t __alsa_alloca_size;
  snd_pcm_hw_params_t *hwParams;
  PaSampleFormat available;
  snd_pcm_t *pcm_local;
  
  hwParams = (snd_pcm_hw_params_t *)0x0;
  uStack_30 = 0x116d8d;
  available = (PaSampleFormat)pcm;
  __n = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  local_28 = __n;
  __alsa_alloca_size = (size_t)((long)&local_28 + lVar1);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116db9;
  memset((void *)((long)&local_28 + lVar1),0,__n);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116dca;
  (*(code *)alsa_snd_pcm_hw_params_any)(PVar3,sVar2);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116ddd;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116dfa;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,1);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116e17;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,2);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116e34;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,3);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116e51;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,4);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116e6e;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,5);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116e8b;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,6);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116ea8;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,7);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116ec5;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,8);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116ee2;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,9);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116eff;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0xe);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116f1c;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0xf);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116f39;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x10);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116f56;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x11);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116f73;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x12);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116f90;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x13);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116fad;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x14);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116fca;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x15);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x116fe7;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x16);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117004;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x17);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117021;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x18);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11703e;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x1f);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11705b;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x20);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117078;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x21);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117095;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x22);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1170b2;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x23);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1170cf;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x24);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1170ec;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x25);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117109;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x26);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117126;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x27);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117143;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x28);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117160;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x29);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11717d;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x2a);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11719a;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x2b);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1171b7;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,2);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1171d4;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,4);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1171f1;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,6);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11720e;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,8);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11722b;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,10);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117248;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0xc);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117265;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0xe);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x117282;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x10);
  PVar3 = available;
  sVar2 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11729f;
  (*(code *)alsa_snd_pcm_hw_params_test_format)(PVar3,sVar2,0x12);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}